

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

void __thiscall ST::string::to_buffer(string *this,wchar_buffer *result)

{
  wchar_buffer local_58;
  buffer<wchar_t> *local_18;
  wchar_buffer *result_local;
  string *this_local;
  
  local_18 = result;
  result_local = (wchar_buffer *)this;
  to_wchar(&local_58,this);
  buffer<wchar_t>::operator=(local_18,&local_58);
  buffer<wchar_t>::~buffer(&local_58);
  return;
}

Assistant:

void to_buffer(wchar_buffer &result) const
        {
            result = to_wchar();
        }